

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::anon_unknown_0::FieldDescriptorCompare::operator()
          (FieldDescriptorCompare *this,FieldDescriptor *f1,FieldDescriptor *f2)

{
  bool bVar1;
  
  if (this == (FieldDescriptorCompare *)0x0) {
    return false;
  }
  if (f1 != (FieldDescriptor *)0x0) {
    bVar1 = std::operator<(*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (this + 8),
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (f1 + 8));
    return bVar1;
  }
  return true;
}

Assistant:

bool operator ()(const FieldDescriptor* f1, const FieldDescriptor* f2) const {
    if(f1 == NULL) {
      return false;
    }
    if(f2 == NULL) {
      return true;
    }
    return f1->full_name() < f2->full_name();
  }